

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

Sections QDateTimeEditPrivate::convertSections(Sections s)

{
  Int IVar1;
  QFlagsStorage<QDateTimeParser::Section> QVar2;
  long in_FS_OFFSET;
  Sections ret;
  Section in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_28;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_24;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_20;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_1c;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_18;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_14;
  QFlagsStorage<QDateTimeEdit::Section> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c.i = 0xaaaaaaaa;
  QFlags<QDateTimeEdit::Section>::QFlags((QFlags<QDateTimeEdit::Section> *)0x55ae7e);
  local_14.super_QFlagsStorage<QDateTimeParser::Section>.i =
       (QFlagsStorage<QDateTimeParser::Section>)
       QFlags<QDateTimeParser::Section>::operator&
                 ((QFlags<QDateTimeParser::Section> *)
                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffcc);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
  if (IVar1 != 0) {
    QFlags<QDateTimeEdit::Section>::operator|=
              ((QFlags<QDateTimeEdit::Section> *)&local_c,MSecSection);
  }
  local_18.super_QFlagsStorage<QDateTimeParser::Section>.i =
       (QFlagsStorage<QDateTimeParser::Section>)
       QFlags<QDateTimeParser::Section>::operator&
                 ((QFlags<QDateTimeParser::Section> *)
                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffcc);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_18);
  if (IVar1 != 0) {
    QFlags<QDateTimeEdit::Section>::operator|=
              ((QFlags<QDateTimeEdit::Section> *)&local_c,SecondSection);
  }
  local_1c.super_QFlagsStorage<QDateTimeParser::Section>.i =
       (QFlagsStorage<QDateTimeParser::Section>)
       QFlags<QDateTimeParser::Section>::operator&
                 ((QFlags<QDateTimeParser::Section> *)
                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffcc);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
  if (IVar1 != 0) {
    QFlags<QDateTimeEdit::Section>::operator|=
              ((QFlags<QDateTimeEdit::Section> *)&local_c,MinuteSection);
  }
  local_20.super_QFlagsStorage<QDateTimeParser::Section>.i =
       (QFlagsStorage<QDateTimeParser::Section>)
       QFlags<QDateTimeParser::Section>::operator&
                 ((QFlags<QDateTimeParser::Section> *)
                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffcc);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_20);
  if (IVar1 != 0) {
    QFlags<QDateTimeEdit::Section>::operator|=
              ((QFlags<QDateTimeEdit::Section> *)&local_c,HourSection);
  }
  local_24.super_QFlagsStorage<QDateTimeParser::Section>.i =
       (QFlagsStorage<QDateTimeParser::Section>)
       QFlags<QDateTimeParser::Section>::operator&
                 ((QFlags<QDateTimeParser::Section> *)
                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffcc);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_24);
  if (IVar1 != 0) {
    QFlags<QDateTimeEdit::Section>::operator|=
              ((QFlags<QDateTimeEdit::Section> *)&local_c,AmPmSection);
  }
  local_28.super_QFlagsStorage<QDateTimeParser::Section>.i =
       (QFlagsStorage<QDateTimeParser::Section>)
       QFlags<QDateTimeParser::Section>::operator&
                 ((QFlags<QDateTimeParser::Section> *)
                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffcc);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_28);
  if (IVar1 != 0) {
    QFlags<QDateTimeEdit::Section>::operator|=
              ((QFlags<QDateTimeEdit::Section> *)&local_c,DaySection);
  }
  QVar2.i = (Int)QFlags<QDateTimeParser::Section>::operator&
                           ((QFlags<QDateTimeParser::Section> *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffcc);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffffd4);
  if (IVar1 != 0) {
    QFlags<QDateTimeEdit::Section>::operator|=
              ((QFlags<QDateTimeEdit::Section> *)&local_c,MonthSection);
  }
  QFlags<QDateTimeParser::Section>::operator&
            ((QFlags<QDateTimeParser::Section> *)CONCAT44(QVar2.i,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffcc);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffffd0);
  if (IVar1 != 0) {
    QFlags<QDateTimeEdit::Section>::operator|=
              ((QFlags<QDateTimeEdit::Section> *)&local_c,YearSection);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QFlagsStorageHelper<QDateTimeEdit::Section,_4>)
           (QFlagsStorageHelper<QDateTimeEdit::Section,_4>)local_c.i;
  }
  __stack_chk_fail();
}

Assistant:

QDateTimeEdit::Sections QDateTimeEditPrivate::convertSections(QDateTimeParser::Sections s)
{
    QDateTimeEdit::Sections ret;
    if (s & QDateTimeParser::MSecSection)
        ret |= QDateTimeEdit::MSecSection;
    if (s & QDateTimeParser::SecondSection)
        ret |= QDateTimeEdit::SecondSection;
    if (s & QDateTimeParser::MinuteSection)
        ret |= QDateTimeEdit::MinuteSection;
    if (s & (QDateTimeParser::HourSectionMask))
        ret |= QDateTimeEdit::HourSection;
    if (s & QDateTimeParser::AmPmSection)
        ret |= QDateTimeEdit::AmPmSection;
    if (s & (QDateTimeParser::DaySectionMask))
        ret |= QDateTimeEdit::DaySection;
    if (s & QDateTimeParser::MonthSection)
        ret |= QDateTimeEdit::MonthSection;
    if (s & (QDateTimeParser::YearSectionMask))
        ret |= QDateTimeEdit::YearSection;

    return ret;
}